

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeMergeEngineCompare(MergeEngine *pMerger,int iOut)

{
  int iVar1;
  int local_3c;
  int res;
  int bCached;
  SortSubtask *pTask;
  PmaReader *p2;
  PmaReader *p1;
  int iRes;
  int i2;
  int i1;
  int iOut_local;
  MergeEngine *pMerger_local;
  
  if (iOut < pMerger->nTree / 2) {
    iRes = pMerger->aTree[iOut << 1];
    p1._4_4_ = pMerger->aTree[iOut * 2 + 1];
  }
  else {
    iRes = (iOut - pMerger->nTree / 2) * 2;
    p1._4_4_ = iRes + 1;
  }
  p2 = pMerger->aReadr + iRes;
  pTask = (SortSubtask *)(pMerger->aReadr + p1._4_4_);
  i2 = iOut;
  _i1 = pMerger;
  if (p2->pFd == (sqlite3_file *)0x0) {
    p1._0_4_ = p1._4_4_;
  }
  else if (pTask->pUnpacked == (UnpackedRecord *)0x0) {
    p1._0_4_ = iRes;
  }
  else {
    _res = pMerger->pTask;
    local_3c = 0;
    iVar1 = (*_res->xCompare)(_res,&local_3c,p2->aKey,p2->nKey,(pTask->list).aMemory,
                              *(int *)((long)&pTask->pSorter + 4));
    if (iVar1 < 1) {
      p1._0_4_ = iRes;
    }
    else {
      p1._0_4_ = p1._4_4_;
    }
  }
  _i1->aTree[i2] = (int)p1;
  return;
}

Assistant:

static void vdbeMergeEngineCompare(
  MergeEngine *pMerger,  /* Merge engine containing PmaReaders to compare */
  int iOut               /* Store the result in pMerger->aTree[iOut] */
){
  int i1;
  int i2;
  int iRes;
  PmaReader *p1;
  PmaReader *p2;

  assert( iOut<pMerger->nTree && iOut>0 );

  if( iOut>=(pMerger->nTree/2) ){
    i1 = (iOut - pMerger->nTree/2) * 2;
    i2 = i1 + 1;
  }else{
    i1 = pMerger->aTree[iOut*2];
    i2 = pMerger->aTree[iOut*2+1];
  }

  p1 = &pMerger->aReadr[i1];
  p2 = &pMerger->aReadr[i2];

  if( p1->pFd==0 ){
    iRes = i2;
  }else if( p2->pFd==0 ){
    iRes = i1;
  }else{
    SortSubtask *pTask = pMerger->pTask;
    int bCached = 0;
    int res;
    assert( pTask->pUnpacked!=0 );  /* from vdbeSortSubtaskMain() */
    res = pTask->xCompare(
        pTask, &bCached, p1->aKey, p1->nKey, p2->aKey, p2->nKey
    );
    if( res<=0 ){
      iRes = i1;
    }else{
      iRes = i2;
    }
  }

  pMerger->aTree[iOut] = iRes;
}